

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::packageHoistedValue
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HoistedVal *hoisted,
          size_t sizeHint)

{
  undefined8 *puVar1;
  pointer ppEVar2;
  LocalGet *pLVar3;
  undefined4 uVar4;
  IRBuilder *this_00;
  Type TVar5;
  ScopeCtx *pSVar6;
  size_t sVar7;
  TupleExtract *pTVar8;
  Type *pTVar9;
  LocalSet *this_01;
  Expression *pEVar10;
  Index IVar11;
  HoistedVal *pHVar12;
  char cVar13;
  undefined1 local_e0 [8];
  Result<unsigned_int> scratch;
  Result<unsigned_int> _val;
  anon_class_24_3_cfa6b6c1 packageAsBlock;
  undefined8 local_70;
  HoistedVal local_68;
  size_t local_58;
  Result<wasm::Ok> *local_50;
  IRBuilder *local_48;
  Index local_3c;
  Type local_38;
  Type type;
  
  pSVar6 = getScope(this);
  ppEVar2 = (pSVar6->exprStack).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((pSVar6->exprStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppEVar2) {
    __assert_fail("!scope.exprStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                  ,0x62,"Result<> wasm::IRBuilder::packageHoistedValue(const HoistedVal &, size_t)")
    ;
  }
  local_38.id = (ppEVar2[-1]->type).id;
  _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
  super__Move_assign_alias<unsigned_int,_wasm::Err>.
  super__Copy_assign_alias<unsigned_int,_wasm::Err>.super__Move_ctor_alias<unsigned_int,_wasm::Err>.
  super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
  super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = this;
  packageAsBlock.this = (IRBuilder *)pSVar6;
  packageAsBlock.scope = (ScopeCtx *)hoisted;
  sVar7 = wasm::Type::size(&local_38);
  local_50 = __return_storage_ptr__;
  if ((sVar7 == sizeHint) || (sVar7 = wasm::Type::size(&local_38), sVar7 < 2)) {
    if (hoisted->get != (LocalGet *)0x0) {
      packageHoistedValue::anon_class_24_3_cfa6b6c1::operator()
                ((anon_class_24_3_cfa6b6c1 *)
                 ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),local_38);
    }
  }
  else {
    pLVar3 = hoisted->get;
    local_48 = this;
    if (pLVar3 == (LocalGet *)0x0) {
      addScratchLocal((Result<unsigned_int> *)local_e0,this,local_38);
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)
                 ((long)&scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
                 (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_e0);
      if (_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
        pHVar12 = &local_68;
        packageAsBlock.hoisted = pHVar12;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&packageAsBlock.hoisted,
                   scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
                   super__Move_assign_alias<unsigned_int,_wasm::Err>.
                   super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                   super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                   super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                   super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_,
                   _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                   super__Move_assign_alias<unsigned_int,_wasm::Err>.
                   super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                   super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                   super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                   super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._0_8_ +
                   scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
                   super__Move_assign_alias<unsigned_int,_wasm::Err>.
                   super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                   super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                   super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                   super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if (packageAsBlock.hoisted == pHVar12) {
          *puVar1 = CONCAT71(local_68._1_7_,(undefined1)local_68.valIndex);
          *(LocalGet **)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = local_68.get;
        }
        else {
          *(HoistedVal **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = packageAsBlock.hoisted;
          *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(local_68._1_7_,(undefined1)local_68.valIndex);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_70;
        local_68.valIndex._0_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        packageAsBlock.hoisted = pHVar12;
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                          ((long)&scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        cVar13 = '\x01';
      }
      else {
        local_3c = CONCAT31(local_3c._1_3_,
                            _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                            super__Move_assign_alias<unsigned_int,_wasm::Err>.
                            super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                            super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                            super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                            super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_);
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                          ((long)&scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        TVar5.id = local_38.id;
        uVar4 = local_e0._0_4_;
        pEVar10 = (pSVar6->exprStack).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1];
        this_01 = (LocalSet *)MixedArena::allocSpace(&((local_48->builder).wasm)->allocator,0x20,8);
        (this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id =
             LocalSetId;
        (this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
        this_01->index = uVar4;
        this_01->value = pEVar10;
        LocalSet::makeTee(this_01,TVar5);
        pTVar8 = (TupleExtract *)
                 MixedArena::allocSpace(&((local_48->builder).wasm)->allocator,0x20,8);
        (pTVar8->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id =
             TupleExtractId;
        (pTVar8->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id = 0;
        pTVar8->tuple = (Expression *)this_01;
        pTVar8->index = 0;
        TupleExtract::finalize(pTVar8);
        (pSVar6->exprStack).
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] = (Expression *)pTVar8;
        pHVar12 = (HoistedVal *)((ulong)local_e0 & 0xffffffff);
        __return_storage_ptr__ = local_50;
        cVar13 = (char)local_3c;
      }
      IVar11 = (Index)pHVar12;
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_e0);
      if (cVar13 == '\x01') {
        return __return_storage_ptr__;
      }
    }
    else {
      pTVar8 = (TupleExtract *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
      (pTVar8->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id =
           TupleExtractId;
      (pTVar8->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id = 0;
      pTVar8->tuple = (Expression *)pLVar3;
      pTVar8->index = 0;
      TupleExtract::finalize(pTVar8);
      (pSVar6->exprStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] = (Expression *)pTVar8;
      local_e0 = (undefined1  [8])&local_38;
      scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._0_8_ = 0;
      pTVar9 = wasm::Type::Iterator::operator*((Iterator *)local_e0);
      packageHoistedValue::anon_class_24_3_cfa6b6c1::operator()
                ((anon_class_24_3_cfa6b6c1 *)
                 ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),(Type)pTVar9->id);
      IVar11 = hoisted->get->index;
    }
    local_3c = IVar11;
    local_58 = wasm::Type::size(&local_38);
    this_00 = local_48;
    if (1 < (uint)local_58) {
      IVar11 = 1;
      do {
        TVar5.id = local_38.id;
        pEVar10 = (Expression *)MixedArena::allocSpace(&((this_00->builder).wasm)->allocator,0x18,8)
        ;
        pEVar10->_id = LocalGetId;
        *(Index *)(pEVar10 + 1) = local_3c;
        (pEVar10->type).id = TVar5.id;
        pTVar8 = (TupleExtract *)
                 MixedArena::allocSpace(&((this_00->builder).wasm)->allocator,0x20,8);
        (pTVar8->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id =
             TupleExtractId;
        (pTVar8->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id = 0;
        pTVar8->tuple = pEVar10;
        pTVar8->index = IVar11;
        TupleExtract::finalize(pTVar8);
        push(this_00,(Expression *)pTVar8);
        IVar11 = IVar11 + 1;
      } while ((Index)local_58 != IVar11);
    }
  }
  *(__index_type *)
   ((long)&(local_50->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return local_50;
}

Assistant:

Result<> IRBuilder::packageHoistedValue(const HoistedVal& hoisted,
                                        size_t sizeHint) {
  auto& scope = getScope();
  assert(!scope.exprStack.empty());

  auto packageAsBlock = [&](Type type) {
    // Create a block containing the producer of the hoisted value, the final
    // get of the hoisted value, and everything in between. Record the fact that
    // we are synthesizing a block to help us determine later whether we need to
    // run the nested pop fixup.
    scopeStack[0].noteSyntheticBlock();
    std::vector<Expression*> exprs(scope.exprStack.begin() + hoisted.valIndex,
                                   scope.exprStack.end());
    auto* block = builder.makeBlock(exprs, type);
    scope.exprStack.resize(hoisted.valIndex);
    push(block);
  };

  auto type = scope.exprStack.back()->type;

  if (type.size() == sizeHint || type.size() <= 1) {
    if (hoisted.get) {
      packageAsBlock(type);
    }
    return Ok{};
  }

  // We need to break up the hoisted tuple. Create and push an expression
  // setting the tuple to a local and returning its first element, then push
  // additional gets of each of its subsequent elements. Reuse the scratch local
  // we used for hoisting, if it exists.
  Index scratchIdx;
  if (hoisted.get) {
    // Update the get on top of the stack to just return the first element.
    scope.exprStack.back() = builder.makeTupleExtract(hoisted.get, 0);
    packageAsBlock(type[0]);
    scratchIdx = hoisted.get->index;
  } else {
    auto scratch = addScratchLocal(type);
    CHECK_ERR(scratch);
    scope.exprStack.back() = builder.makeTupleExtract(
      builder.makeLocalTee(*scratch, scope.exprStack.back(), type), 0);
    scratchIdx = *scratch;
  }
  for (Index i = 1, size = type.size(); i < size; ++i) {
    push(builder.makeTupleExtract(builder.makeLocalGet(scratchIdx, type), i));
  }
  return Ok{};
}